

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O3

void __thiscall duckdb::ARTMerger::MergeLeaves(ARTMerger *this,NodeEntry *entry)

{
  idx_t iVar1;
  ART *art;
  uchar *puVar2;
  Node __tmp;
  Node *pNVar3;
  idx_t iVar4;
  array_ptr<unsigned_char,_true> bytes;
  array_ptr<unsigned_char,_true> local_40;
  
  pNVar3 = entry->right;
  iVar4 = (entry->left->super_IndexPointer).data;
  iVar1 = (pNVar3->super_IndexPointer).data;
  if (((byte)(iVar4 >> 0x38) & 0x7f) < ((byte)(iVar1 >> 0x38) & 0x7f)) {
    (entry->left->super_IndexPointer).data = iVar1;
    (pNVar3->super_IndexPointer).data = iVar4;
    pNVar3 = entry->right;
  }
  local_40 = GetBytes(this,pNVar3);
  if (local_40.count != 0) {
    iVar4 = 0;
    do {
      art = this->art;
      pNVar3 = entry->left;
      puVar2 = array_ptr<unsigned_char,_true>::operator[](&local_40,iVar4);
      Node::InsertChild(art,pNVar3,*puVar2,(Node)0x0);
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_40.count);
  }
  Node::Free(this->art,entry->right);
  return;
}

Assistant:

void ARTMerger::MergeLeaves(NodeEntry &entry) {
	D_ASSERT(entry.left.IsLeafNode());
	D_ASSERT(entry.right.IsLeafNode());
	D_ASSERT(entry.left.GetGateStatus() == GateStatus::GATE_NOT_SET);
	D_ASSERT(entry.right.GetGateStatus() == GateStatus::GATE_NOT_SET);

	// Merge the smaller leaf into the bigger leaf.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the bytes of the right node.
	// Then, copy them into left.
	auto bytes = GetBytes(entry.right);

	// FIXME: Obtain a reference to left once and
	// FIXME: handle the different node type combinations.
	for (idx_t i = 0; i < bytes.size(); i++) {
		Node::InsertChild(art, entry.left, bytes[i]);
	}
	Node::Free(art, entry.right);
}